

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IStreamingReporter> * __thiscall
Catch::Ptr<Catch::IStreamingReporter>::operator=
          (Ptr<Catch::IStreamingReporter> *this,IStreamingReporter *p)

{
  Ptr<Catch::IStreamingReporter> local_20;
  
  if (p != (IStreamingReporter *)0x0) {
    (*(p->super_IShared).super_NonCopyable._vptr_NonCopyable[2])(p);
  }
  local_20 = (Ptr<Catch::IStreamingReporter>)this->m_p;
  this->m_p = p;
  ~Ptr(&local_20);
  return this;
}

Assistant:

Ptr& operator = ( T* p ){
            Ptr temp( p );
            swap( temp );
            return *this;
        }